

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.c
# Opt level: O0

void strip_fileext(char *path,char *root)

{
  bool bVar1;
  size_t l;
  size_t i;
  char *root_local;
  char *path_local;
  
  l = strlen(path);
  do {
    l = l - 1;
    bVar1 = false;
    if (l != 0) {
      bVar1 = path[l] != '.';
    }
  } while (bVar1);
  if (l == 0) {
    strcpy(root,path);
  }
  else {
    strncpy(root,path,l);
  }
  return;
}

Assistant:

void
strip_fileext(const char *path, char *root)
{
    size_t i, l;

    l = strlen(path);
    for (i = l - 1; (i > 0) && (path[i] != '.'); --i);
    if (i == 0) {
        strcpy(root, path);     /* Didn't find a . */
    } else {
        strncpy(root, path, i);
    }
}